

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Transfer_function * __thiscall
lossless_neural_sound::expression_compiler::Arena::
create<lossless_neural_sound::expression_compiler::expression::Transfer_function,lossless_neural_sound::expression_compiler::expression::Transfer_function_const&>
          (Arena *this,Transfer_function *args)

{
  Node_base *pNVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Expression_node *pEVar5;
  size_t sVar6;
  Node_base *pNVar7;
  _Elt_pointer puVar8;
  
  std::
  deque<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>,_std::allocator<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>_>_>
  ::emplace_back<>(&this->small_nodes);
  puVar8 = (this->small_nodes).
           super__Deque_base<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>,_std::allocator<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar8 == (this->small_nodes).
                super__Deque_base<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>,_std::allocator<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    puVar8 = (this->small_nodes).
             super__Deque_base<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>,_std::allocator<std::unique_ptr<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pNVar7 = (Node_base *)
           allocate<lossless_neural_sound::expression_compiler::Arena::Node<lossless_neural_sound::expression_compiler::expression::Transfer_function>>
                     (this);
  pNVar7->_vptr_Node_base = (_func_int **)&PTR__Node_0012ed90;
  pNVar7[2]._vptr_Node_base = (_func_int **)(args->super_Expression_node).super_Node.hash_next;
  pNVar7[1]._vptr_Node_base = (_func_int **)&PTR__Node_0012e818;
  pEVar5 = (args->super_Expression_node).aa_tree_node.left_child;
  uVar2 = *(undefined4 *)&(args->super_Expression_node).aa_tree_node.right_child;
  uVar3 = *(undefined4 *)((long)&(args->super_Expression_node).aa_tree_node.right_child + 4);
  sVar6 = (args->super_Expression_node).aa_tree_node.tree_size;
  uVar4 = *(undefined4 *)((long)&(args->super_Expression_node).aa_tree_node.tree_size + 4);
  pNVar7[3]._vptr_Node_base = (_func_int **)(args->super_Expression_node).aa_tree_node.parent;
  pNVar7[4]._vptr_Node_base = (_func_int **)pEVar5;
  *(undefined4 *)&pNVar7[5]._vptr_Node_base = uVar2;
  *(undefined4 *)((long)&pNVar7[5]._vptr_Node_base + 4) = uVar3;
  *(int *)&pNVar7[6]._vptr_Node_base = (int)sVar6;
  *(undefined4 *)((long)&pNVar7[6]._vptr_Node_base + 4) = uVar4;
  pNVar7[7]._vptr_Node_base = (_func_int **)(args->super_Expression_node).aa_tree_node.tree_level;
  pNVar7[1]._vptr_Node_base = (_func_int **)&PTR__Node_0012ed00;
  uVar2 = *(undefined4 *)((long)&args->arg + 4);
  sVar6 = args->derivative_count;
  uVar3 = *(undefined4 *)((long)&args->derivative_count + 4);
  *(undefined4 *)&pNVar7[8]._vptr_Node_base = *(undefined4 *)&args->arg;
  *(undefined4 *)((long)&pNVar7[8]._vptr_Node_base + 4) = uVar2;
  *(int *)&pNVar7[9]._vptr_Node_base = (int)sVar6;
  *(undefined4 *)((long)&pNVar7[9]._vptr_Node_base + 4) = uVar3;
  pNVar1 = puVar8[-1]._M_t.
           super___uniq_ptr_impl<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
           ._M_t.
           super__Tuple_impl<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
           .
           super__Head_base<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_false>
           ._M_head_impl;
  puVar8[-1]._M_t.
  super___uniq_ptr_impl<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
  ._M_t.
  super__Tuple_impl<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
  .super__Head_base<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_false>.
  _M_head_impl = pNVar7;
  if (pNVar1 != (Node_base *)0x0) {
    (**pNVar1->_vptr_Node_base)();
    pNVar7 = puVar8[-1]._M_t.
             super___uniq_ptr_impl<lossless_neural_sound::expression_compiler::Arena::Node_base,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
             ._M_t.
             super__Tuple_impl<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_lossless_neural_sound::expression_compiler::Arena::Destroy_only>
             .
             super__Head_base<0UL,_lossless_neural_sound::expression_compiler::Arena::Node_base_*,_false>
             ._M_head_impl;
  }
  return (Transfer_function *)(pNVar7 + 1);
}

Assistant:

T *create(Args &&... args)
    {
        if(sizeof(Node<T>) >= big_memory_block_start_size)
        {
            big_nodes.emplace_back(); // allocate slot first
            auto &retval = big_nodes.back();
            retval.reset(new Node<T>(std::forward<Args>(args)...));
            return std::addressof(static_cast<Node<T> *>(retval.get())->value);
        }
        if(std::is_trivially_destructible<T>::value)
        {
            // don't need to keep in small_nodes because we don't need to call the destructor
            return new(allocate<T>()) T(std::forward<Args>(args)...);
        }
        small_nodes.emplace_back(); // allocate slot first
        auto &retval = small_nodes.back();
        retval.reset(new(allocate<Node<T>>()) Node<T>(std::forward<Args>(args)...));
        return std::addressof(static_cast<Node<T> *>(retval.get())->value);
    }